

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O0

void * add234_internal(tree234 *t,void *e,int index)

{
  int iVar1;
  node234_conflict *pnVar2;
  int local_90;
  int local_8c;
  node234_conflict *local_88;
  node234_conflict *local_80;
  node234_conflict *local_78;
  int childnum_1;
  int count;
  node234_conflict *m;
  int childnum;
  int rcount;
  int lcount;
  int c;
  void *orig_e;
  node234_conflict *right;
  node234_conflict *left;
  node234_conflict **np;
  node234_conflict *n;
  node234_conflict *pnStack_20;
  int index_local;
  void *e_local;
  tree234 *t_local;
  
  if (t->root == (node234_conflict *)0x0) {
    pnVar2 = (node234_conflict *)safemalloc(1,0x50,0);
    t->root = pnVar2;
    t->root->elems[2] = (void *)0x0;
    t->root->elems[1] = (void *)0x0;
    t->root->kids[1] = (node234 *)0x0;
    t->root->kids[0] = (node234 *)0x0;
    t->root->kids[3] = (node234 *)0x0;
    t->root->kids[2] = (node234 *)0x0;
    t->root->counts[1] = 0;
    t->root->counts[0] = 0;
    t->root->counts[3] = 0;
    t->root->counts[2] = 0;
    t->root->parent = (node234_conflict *)0x0;
    t->root->elems[0] = e;
  }
  else {
    np = (node234_conflict **)0x0;
    left = (node234_conflict *)t;
    n._4_4_ = index;
    while (left->parent != (node234_conflict *)0x0) {
      np = &left->parent->parent;
      if (n._4_4_ < 0) {
        iVar1 = (*t->cmp)(e,((node234_conflict *)np)->elems[0]);
        if (iVar1 < 0) {
          m._0_4_ = 0;
        }
        else {
          if (iVar1 == 0) {
            return ((node234_conflict *)np)->elems[0];
          }
          if ((((node234_conflict *)np)->elems[1] == (void *)0x0) ||
             (iVar1 = (*t->cmp)(e,((node234_conflict *)np)->elems[1]), iVar1 < 0)) {
            m._0_4_ = 1;
          }
          else {
            if (iVar1 == 0) {
              return ((node234_conflict *)np)->elems[1];
            }
            if ((((node234_conflict *)np)->elems[2] == (void *)0x0) ||
               (iVar1 = (*t->cmp)(e,((node234_conflict *)np)->elems[2]), iVar1 < 0)) {
              m._0_4_ = 2;
            }
            else {
              if (iVar1 == 0) {
                return ((node234_conflict *)np)->elems[2];
              }
              m._0_4_ = 3;
            }
          }
        }
      }
      else if (((node234_conflict *)np)->kids[0] == (node234 *)0x0) {
        m._0_4_ = n._4_4_;
      }
      else if (((node234_conflict *)np)->counts[0] < n._4_4_) {
        n._4_4_ = n._4_4_ - (((node234_conflict *)np)->counts[0] + 1);
        if (((node234_conflict *)np)->counts[1] < n._4_4_) {
          n._4_4_ = n._4_4_ - (((node234_conflict *)np)->counts[1] + 1);
          if (((node234_conflict *)np)->counts[2] < n._4_4_) {
            n._4_4_ = n._4_4_ - (((node234_conflict *)np)->counts[2] + 1);
            if (((node234_conflict *)np)->counts[3] < n._4_4_) {
              return (void *)0x0;
            }
            m._0_4_ = 3;
          }
          else {
            m._0_4_ = 2;
          }
        }
        else {
          m._0_4_ = 1;
        }
      }
      else {
        m._0_4_ = 0;
      }
      left = (node234_conflict *)(((node234_conflict *)np)->kids + (int)m);
    }
    right = (node234_conflict *)0x0;
    childnum = 0;
    orig_e = (void *)0x0;
    m._4_4_ = 0;
    pnStack_20 = (node234_conflict *)e;
    for (; np != (node234_conflict **)0x0; np = &(*np)->parent) {
      if (np[8] == (node234_conflict *)0x0) {
        if (left == (node234_conflict *)(np + 1)) {
          np[3] = np[2];
          *(undefined4 *)(np + 6) = *(undefined4 *)((long)np + 0x2c);
          np[8] = np[7];
          np[2] = (node234_conflict *)orig_e;
          *(int *)((long)np + 0x2c) = m._4_4_;
          np[7] = pnStack_20;
          np[1] = right;
          *(int *)(np + 5) = childnum;
        }
        else {
          np[3] = (node234_conflict *)orig_e;
          *(int *)(np + 6) = m._4_4_;
          np[8] = pnStack_20;
          np[2] = right;
          *(int *)((long)np + 0x2c) = childnum;
        }
        if (np[1] != (node234_conflict *)0x0) {
          np[1]->parent = (node234_conflict *)np;
        }
        if (np[2] != (node234_conflict *)0x0) {
          np[2]->parent = (node234_conflict *)np;
        }
        if (np[3] != (node234_conflict *)0x0) {
          np[3]->parent = (node234_conflict *)np;
        }
        break;
      }
      if (np[9] == (node234_conflict *)0x0) {
        if (left == (node234_conflict *)(np + 1)) {
          np[4] = np[3];
          *(undefined4 *)((long)np + 0x34) = *(undefined4 *)(np + 6);
          np[9] = np[8];
          np[3] = np[2];
          *(undefined4 *)(np + 6) = *(undefined4 *)((long)np + 0x2c);
          np[8] = np[7];
          np[2] = (node234_conflict *)orig_e;
          *(int *)((long)np + 0x2c) = m._4_4_;
          np[7] = pnStack_20;
          np[1] = right;
          *(int *)(np + 5) = childnum;
        }
        else if (left == (node234_conflict *)(np + 2)) {
          np[4] = np[3];
          *(undefined4 *)((long)np + 0x34) = *(undefined4 *)(np + 6);
          np[9] = np[8];
          np[3] = (node234_conflict *)orig_e;
          *(int *)(np + 6) = m._4_4_;
          np[8] = pnStack_20;
          np[2] = right;
          *(int *)((long)np + 0x2c) = childnum;
        }
        else {
          np[4] = (node234_conflict *)orig_e;
          *(int *)((long)np + 0x34) = m._4_4_;
          np[9] = pnStack_20;
          np[3] = right;
          *(int *)(np + 6) = childnum;
        }
        if (np[1] != (node234_conflict *)0x0) {
          np[1]->parent = (node234_conflict *)np;
        }
        if (np[2] != (node234_conflict *)0x0) {
          np[2]->parent = (node234_conflict *)np;
        }
        if (np[3] != (node234_conflict *)0x0) {
          np[3]->parent = (node234_conflict *)np;
        }
        if (np[4] != (node234_conflict *)0x0) {
          np[4]->parent = (node234_conflict *)np;
        }
        break;
      }
      pnVar2 = (node234_conflict *)safemalloc(1,0x50,0);
      pnVar2->parent = *np;
      if (left == (node234_conflict *)(np + 1)) {
        pnVar2->kids[0] = right;
        pnVar2->counts[0] = childnum;
        pnVar2->elems[0] = pnStack_20;
        pnVar2->kids[1] = (node234 *)orig_e;
        pnVar2->counts[1] = m._4_4_;
        pnVar2->elems[1] = np[7];
        pnVar2->kids[2] = np[2];
        pnVar2->counts[2] = *(int *)((long)np + 0x2c);
        pnStack_20 = np[8];
        np[1] = np[3];
        *(undefined4 *)(np + 5) = *(undefined4 *)(np + 6);
        np[7] = np[9];
        np[2] = np[4];
        *(undefined4 *)((long)np + 0x2c) = *(undefined4 *)((long)np + 0x34);
      }
      else if (left == (node234_conflict *)(np + 2)) {
        pnVar2->kids[0] = np[1];
        pnVar2->counts[0] = *(int *)(np + 5);
        pnVar2->elems[0] = np[7];
        pnVar2->kids[1] = right;
        pnVar2->counts[1] = childnum;
        pnVar2->elems[1] = pnStack_20;
        pnVar2->kids[2] = (node234 *)orig_e;
        pnVar2->counts[2] = m._4_4_;
        pnStack_20 = np[8];
        np[1] = np[3];
        *(undefined4 *)(np + 5) = *(undefined4 *)(np + 6);
        np[7] = np[9];
        np[2] = np[4];
        *(undefined4 *)((long)np + 0x2c) = *(undefined4 *)((long)np + 0x34);
      }
      else if (left == (node234_conflict *)(np + 3)) {
        pnVar2->kids[0] = np[1];
        pnVar2->counts[0] = *(int *)(np + 5);
        pnVar2->elems[0] = np[7];
        pnVar2->kids[1] = np[2];
        pnVar2->counts[1] = *(int *)((long)np + 0x2c);
        pnVar2->elems[1] = np[8];
        pnVar2->kids[2] = right;
        pnVar2->counts[2] = childnum;
        np[1] = (node234_conflict *)orig_e;
        *(int *)(np + 5) = m._4_4_;
        np[7] = np[9];
        np[2] = np[4];
        *(undefined4 *)((long)np + 0x2c) = *(undefined4 *)((long)np + 0x34);
      }
      else {
        pnVar2->kids[0] = np[1];
        pnVar2->counts[0] = *(int *)(np + 5);
        pnVar2->elems[0] = np[7];
        pnVar2->kids[1] = np[2];
        pnVar2->counts[1] = *(int *)((long)np + 0x2c);
        pnVar2->elems[1] = np[8];
        pnVar2->kids[2] = np[3];
        pnVar2->counts[2] = *(int *)(np + 6);
        np[1] = right;
        *(int *)(np + 5) = childnum;
        np[7] = pnStack_20;
        np[2] = (node234_conflict *)orig_e;
        *(int *)((long)np + 0x2c) = m._4_4_;
        pnStack_20 = np[9];
      }
      np[3] = (node234_conflict *)0x0;
      np[4] = (node234_conflict *)0x0;
      pnVar2->kids[3] = (node234 *)0x0;
      *(undefined4 *)(np + 6) = 0;
      *(undefined4 *)((long)np + 0x34) = 0;
      pnVar2->counts[3] = 0;
      np[8] = (node234_conflict *)0x0;
      np[9] = (node234_conflict *)0x0;
      pnVar2->elems[2] = (void *)0x0;
      if (pnVar2->kids[0] != (node234 *)0x0) {
        pnVar2->kids[0]->parent = pnVar2;
      }
      if (pnVar2->kids[1] != (node234 *)0x0) {
        pnVar2->kids[1]->parent = pnVar2;
      }
      if (pnVar2->kids[2] != (node234 *)0x0) {
        pnVar2->kids[2]->parent = pnVar2;
      }
      if (np[1] != (node234_conflict *)0x0) {
        np[1]->parent = (node234_conflict *)np;
      }
      if (np[2] != (node234_conflict *)0x0) {
        np[2]->parent = (node234_conflict *)np;
      }
      childnum = countnode234(pnVar2);
      orig_e = np;
      m._4_4_ = countnode234((node234_conflict *)np);
      if (*np != (node234_conflict *)0x0) {
        if ((*np)->kids[0] == (node234 *)np) {
          local_78 = (node234_conflict *)(*np)->kids;
        }
        else {
          if ((*np)->kids[1] == (node234 *)np) {
            local_80 = (node234_conflict *)((*np)->kids + 1);
          }
          else {
            if ((*np)->kids[2] == (node234 *)np) {
              local_88 = (node234_conflict *)((*np)->kids + 2);
            }
            else {
              local_88 = (node234_conflict *)((*np)->kids + 3);
            }
            local_80 = local_88;
          }
          local_78 = local_80;
        }
        left = local_78;
      }
      right = pnVar2;
    }
    if (np == (node234_conflict **)0x0) {
      pnVar2 = (node234_conflict *)safemalloc(1,0x50,0);
      t->root = pnVar2;
      t->root->kids[0] = right;
      t->root->counts[0] = childnum;
      t->root->elems[0] = pnStack_20;
      t->root->kids[1] = (node234 *)orig_e;
      t->root->counts[1] = m._4_4_;
      t->root->elems[1] = (void *)0x0;
      t->root->kids[2] = (node234 *)0x0;
      t->root->counts[2] = 0;
      t->root->elems[2] = (void *)0x0;
      t->root->kids[3] = (node234 *)0x0;
      t->root->counts[3] = 0;
      t->root->parent = (node234_conflict *)0x0;
      if (t->root->kids[0] != (node234 *)0x0) {
        t->root->kids[0]->parent = t->root;
      }
      if (t->root->kids[1] != (node234 *)0x0) {
        t->root->kids[1]->parent = t->root;
      }
    }
    else {
      for (; *np != (node234_conflict *)0x0; np = &(*np)->parent) {
        iVar1 = countnode234((node234_conflict *)np);
        if ((*np)->kids[0] == (node234 *)np) {
          local_8c = 0;
        }
        else {
          if ((*np)->kids[1] == (node234 *)np) {
            local_90 = 1;
          }
          else {
            local_90 = 3;
            if ((*np)->kids[2] == (node234 *)np) {
              local_90 = 2;
            }
          }
          local_8c = local_90;
        }
        (*np)->counts[local_8c] = iVar1;
      }
    }
  }
  return e;
}

Assistant:

static void *add234_internal(tree234 * t, void *e, int index)
{
    node234 *n, **np, *left, *right;
    void *orig_e = e;
    int c, lcount, rcount;

    LOG(("adding node %p to tree %p\n", e, t));
    if (t->root == NULL) {
        t->root = snew(node234);
        t->root->elems[1] = t->root->elems[2] = NULL;
        t->root->kids[0] = t->root->kids[1] = NULL;
        t->root->kids[2] = t->root->kids[3] = NULL;
        t->root->counts[0] = t->root->counts[1] = 0;
        t->root->counts[2] = t->root->counts[3] = 0;
        t->root->parent = NULL;
        t->root->elems[0] = e;
        LOG(("  created root %p\n", t->root));
        return orig_e;
    }

    n = NULL; /* placate gcc; will always be set below since t->root != NULL */
    np = &t->root;
    while (*np) {
        int childnum;
        n = *np;
        LOG(("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        if (index >= 0) {
            if (!n->kids[0]) {
                /*
                 * Leaf node. We want to insert at kid position
                 * equal to the index:
                 *
                 *   0 A 1 B 2 C 3
                 */
                childnum = index;
            } else {
                /*
                 * Internal node. We always descend through it (add
                 * always starts at the bottom, never in the
                 * middle).
                 */
                do {                   /* this is a do ... while (0) to allow `break' */
                    if (index <= n->counts[0]) {
                        childnum = 0;
                        break;
                    }
                    index -= n->counts[0] + 1;
                    if (index <= n->counts[1]) {
                        childnum = 1;
                        break;
                    }
                    index -= n->counts[1] + 1;
                    if (index <= n->counts[2]) {
                        childnum = 2;
                        break;
                    }
                    index -= n->counts[2] + 1;
                    if (index <= n->counts[3]) {
                        childnum = 3;
                        break;
                    }
                    return NULL;       /* error: index out of range */
                } while (0);
            }
        } else {
            if ((c = t->cmp(e, n->elems[0])) < 0)
                childnum = 0;
            else if (c == 0)
                return n->elems[0];    /* already exists */
            else if (n->elems[1] == NULL
                     || (c = t->cmp(e, n->elems[1])) < 0) childnum = 1;
            else if (c == 0)
                return n->elems[1];    /* already exists */
            else if (n->elems[2] == NULL
                     || (c = t->cmp(e, n->elems[2])) < 0) childnum = 2;
            else if (c == 0)
                return n->elems[2];    /* already exists */
            else
                childnum = 3;
        }
        np = &n->kids[childnum];
        LOG(("  moving to child %d (%p)\n", childnum, *np));
    }

    /*
     * We need to insert the new element in n at position np.
     */
    left = NULL;
    lcount = 0;
    right = NULL;
    rcount = 0;
    while (n) {
        LOG(("  at %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d\n",
             n,
             n->kids[0], n->counts[0], n->elems[0],
             n->kids[1], n->counts[1], n->elems[1],
             n->kids[2], n->counts[2], n->elems[2],
             n->kids[3], n->counts[3]));
        LOG(("  need to insert %p/%d [%p] %p/%d at position %d\n",
             left, lcount, e, right, rcount, (int)(np - n->kids)));
        if (n->elems[1] == NULL) {
            /*
             * Insert in a 2-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 2-node\n"));
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else {                   /* np == &n->kids[1] */
                LOG(("  inserting on right of 2-node\n"));
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            LOG(("  done\n"));
            break;
        } else if (n->elems[2] == NULL) {
            /*
             * Insert in a 3-node; simple.
             */
            if (np == &n->kids[0]) {
                LOG(("  inserting on left of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = n->kids[1];
                n->counts[2] = n->counts[1];
                n->elems[1] = n->elems[0];
                n->kids[1] = right;
                n->counts[1] = rcount;
                n->elems[0] = e;
                n->kids[0] = left;
                n->counts[0] = lcount;
            } else if (np == &n->kids[1]) {
                LOG(("  inserting in middle of 3-node\n"));
                n->kids[3] = n->kids[2];
                n->counts[3] = n->counts[2];
                n->elems[2] = n->elems[1];
                n->kids[2] = right;
                n->counts[2] = rcount;
                n->elems[1] = e;
                n->kids[1] = left;
                n->counts[1] = lcount;
            } else {                   /* np == &n->kids[2] */
                LOG(("  inserting on right of 3-node\n"));
                n->kids[3] = right;
                n->counts[3] = rcount;
                n->elems[2] = e;
                n->kids[2] = left;
                n->counts[2] = lcount;
            }
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            if (n->kids[2])
                n->kids[2]->parent = n;
            if (n->kids[3])
                n->kids[3]->parent = n;
            LOG(("  done\n"));
            break;
        } else {
            node234 *m = snew(node234);
            m->parent = n->parent;
            LOG(("  splitting a 4-node; created new node %p\n", m));
            /*
             * Insert in a 4-node; split into a 2-node and a
             * 3-node, and move focus up a level.
             *
             * I don't think it matters which way round we put the
             * 2 and the 3. For simplicity, we'll put the 3 first
             * always.
             */
            if (np == &n->kids[0]) {
                m->kids[0] = left;
                m->counts[0] = lcount;
                m->elems[0] = e;
                m->kids[1] = right;
                m->counts[1] = rcount;
                m->elems[1] = n->elems[0];
                m->kids[2] = n->kids[1];
                m->counts[2] = n->counts[1];
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[1]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = left;
                m->counts[1] = lcount;
                m->elems[1] = e;
                m->kids[2] = right;
                m->counts[2] = rcount;
                e = n->elems[1];
                n->kids[0] = n->kids[2];
                n->counts[0] = n->counts[2];
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else if (np == &n->kids[2]) {
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = left;
                m->counts[2] = lcount;
                /* e = e; */
                n->kids[0] = right;
                n->counts[0] = rcount;
                n->elems[0] = n->elems[2];
                n->kids[1] = n->kids[3];
                n->counts[1] = n->counts[3];
            } else {                   /* np == &n->kids[3] */
                m->kids[0] = n->kids[0];
                m->counts[0] = n->counts[0];
                m->elems[0] = n->elems[0];
                m->kids[1] = n->kids[1];
                m->counts[1] = n->counts[1];
                m->elems[1] = n->elems[1];
                m->kids[2] = n->kids[2];
                m->counts[2] = n->counts[2];
                n->kids[0] = left;
                n->counts[0] = lcount;
                n->elems[0] = e;
                n->kids[1] = right;
                n->counts[1] = rcount;
                e = n->elems[2];
            }
            m->kids[3] = n->kids[3] = n->kids[2] = NULL;
            m->counts[3] = n->counts[3] = n->counts[2] = 0;
            m->elems[2] = n->elems[2] = n->elems[1] = NULL;
            if (m->kids[0])
                m->kids[0]->parent = m;
            if (m->kids[1])
                m->kids[1]->parent = m;
            if (m->kids[2])
                m->kids[2]->parent = m;
            if (n->kids[0])
                n->kids[0]->parent = n;
            if (n->kids[1])
                n->kids[1]->parent = n;
            LOG(("  left (%p): %p/%d [%p] %p/%d [%p] %p/%d\n", m,
                 m->kids[0], m->counts[0], m->elems[0],
                 m->kids[1], m->counts[1], m->elems[1],
                 m->kids[2], m->counts[2]));
            LOG(("  right (%p): %p/%d [%p] %p/%d\n", n,
                 n->kids[0], n->counts[0], n->elems[0],
                 n->kids[1], n->counts[1]));
            left = m;
            lcount = countnode234(left);
            right = n;
            rcount = countnode234(right);
        }
        if (n->parent)
            np = (n->parent->kids[0] == n ? &n->parent->kids[0] :
                  n->parent->kids[1] == n ? &n->parent->kids[1] :
                  n->parent->kids[2] == n ? &n->parent->kids[2] :
                  &n->parent->kids[3]);
        n = n->parent;
    }

    /*
     * If we've come out of here by `break', n will still be
     * non-NULL and all we need to do is go back up the tree
     * updating counts. If we've come here because n is NULL, we
     * need to create a new root for the tree because the old one
     * has just split into two. */
    if (n) {
        while (n->parent) {
            int count = countnode234(n);
            int childnum;
            childnum = (n->parent->kids[0] == n ? 0 :
                        n->parent->kids[1] == n ? 1 :
                        n->parent->kids[2] == n ? 2 : 3);
            n->parent->counts[childnum] = count;
            n = n->parent;
        }
    } else {
        LOG(("  root is overloaded, split into two\n"));
        t->root = snew(node234);
        t->root->kids[0] = left;
        t->root->counts[0] = lcount;
        t->root->elems[0] = e;
        t->root->kids[1] = right;
        t->root->counts[1] = rcount;
        t->root->elems[1] = NULL;
        t->root->kids[2] = NULL;
        t->root->counts[2] = 0;
        t->root->elems[2] = NULL;
        t->root->kids[3] = NULL;
        t->root->counts[3] = 0;
        t->root->parent = NULL;
        if (t->root->kids[0])
            t->root->kids[0]->parent = t->root;
        if (t->root->kids[1])
            t->root->kids[1]->parent = t->root;
        LOG(("  new root is %p/%d [%p] %p/%d\n",
             t->root->kids[0], t->root->counts[0],
             t->root->elems[0], t->root->kids[1], t->root->counts[1]));
    }

    return orig_e;
}